

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::reopen_listen_sockets(session_impl *this,bool map_ports)

{
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *this_00;
  pointer plVar1;
  dht_tracker *pdVar2;
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pbVar3;
  element_type *peVar4;
  natpmp *this_01;
  upnp *this_02;
  lsd *this_03;
  pointer psVar5;
  pointer psVar6;
  pointer plVar7;
  bool bVar8;
  undefined1 uVar9;
  int iVar10;
  iterator __position;
  iterator iVar11;
  pointer psVar12;
  element_type *peVar13;
  long lVar14;
  long lVar15;
  endpoint *extraout_RDX;
  endpoint *ep_00;
  endpoint *extraout_RDX_00;
  endpoint *extraout_RDX_01;
  long lVar16;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *pvVar17;
  listen_endpoint_t *plVar18;
  const_iterator cVar19;
  session_impl *this_04;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  *in_R9;
  pointer ec_00;
  shared_ptr<libtorrent::aux::listen_socket_t> *__begin3;
  pointer psVar20;
  listen_interface_t *iface;
  pointer plVar21;
  shared_ptr<libtorrent::aux::listen_socket_t> *psVar22;
  pointer psVar23;
  shared_ptr<libtorrent::aux::listen_socket_t> *__begin3_3;
  span<const_libtorrent::aux::ip_route> routes_00;
  span<const_libtorrent::aux::ip_interface> ifs;
  span<const_libtorrent::aux::ip_interface> ifs_00;
  span<const_libtorrent::aux::ip_interface> ifs_01;
  error_code ec;
  socket_type_t local_169;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  eps;
  vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> routes;
  listen_endpoint_t ep;
  socket_type_t socket_type;
  undefined7 uStack_97;
  anon_union_16_3_a3f0114d_for___in6_u aStack_90;
  unsigned_long uStack_80;
  __shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  session_log(this,"reopen listen sockets");
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  if (this->m_abort != false) {
    return;
  }
  eps.
  super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  eps.
  super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  eps.
  super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_04 = (session_impl *)&this->m_settings;
  iVar10 = session_settings::get_int((session_settings *)this_04,0x407b);
  if ((iVar10 == 0) ||
     (bVar8 = session_settings::get_bool((session_settings *)this_04,0x8041), !bVar8)) {
    enum_net_interfaces((vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                         *)&ep,this->m_io_context,&ec);
    if ((ec.failed_ == true) && (((this->m_alerts).m_alert_mask._M_i.m_val & 0x41) != 0)) {
      routes.
      super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(routes.
                             super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,0x17);
      _socket_type = _socket_type & 0xffffffffffffff00;
      alert_manager::
      emplace_alert<libtorrent::listen_failed_alert,char_const(&)[1],libtorrent::operation_t,boost::system::error_code&,libtorrent::socket_type_t>
                (&this->m_alerts,(char (*) [1])0x3829db,(operation_t *)&routes,&ec,&socket_type);
    }
    enum_routes(&routes,this->m_io_context,&ec);
    if ((ec.failed_ == true) && (((this->m_alerts).m_alert_mask._M_i.m_val & 0x41) != 0)) {
      _socket_type = CONCAT71(uStack_97,0x2a);
      local_169 = tcp;
      alert_manager::
      emplace_alert<libtorrent::listen_failed_alert,char_const(&)[1],libtorrent::operation_t,boost::system::error_code&,libtorrent::socket_type_t>
                (&this->m_alerts,(char (*) [1])0x3829db,&socket_type,&ec,&local_169);
    }
    plVar1 = (this->m_listen_interfaces).
             super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (plVar21 = (this->m_listen_interfaces).
                   super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
                   ._M_impl.super__Vector_impl_data._M_start; plVar21 != plVar1;
        plVar21 = plVar21 + 1) {
      ifs_01.m_len = (difference_type)&eps;
      ifs_01.m_ptr = (ip_interface *)
                     ((long)(ep.addr.ipv6_address_.addr_.__in6_u._0_8_ - ep.addr._0_8_) / 400);
      interface_to_endpoints
                ((aux *)plVar21,(listen_interface_t *)0x1,
                 (listen_socket_flags_t)(uchar)ep.addr.type_,ifs_01,in_R9);
    }
    if (eps.
        super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        eps.
        super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      session_log(this,"no listen sockets");
    }
    routes_00.m_len =
         ((long)routes.
                super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)routes.
               super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
               ._M_impl.super__Vector_impl_data._M_start) / 200;
    routes_00.m_ptr =
         routes.
         super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>.
         _M_impl.super__Vector_impl_data._M_start;
    ifs.m_len = (long)(ep.addr.ipv6_address_.addr_.__in6_u._0_8_ - ep.addr._0_8_) / 400;
    ifs.m_ptr = (ip_interface *)ep.addr._0_8_;
    expand_unspecified_address(ifs,routes_00,&eps);
    ifs_00.m_len = (long)(ep.addr.ipv6_address_.addr_.__in6_u._0_8_ - ep.addr._0_8_) / 400;
    ifs_00.m_ptr = (ip_interface *)ep.addr._0_8_;
    expand_devices(ifs_00,&eps);
    ::std::_Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>::
    ~_Vector_base(&routes.
                   super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                 );
    ::std::
    _Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                   *)&ep);
  }
  else {
    plVar21 = (this->m_listen_interfaces).
              super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (plVar21 ==
        (this->m_listen_interfaces).
        super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar15 = random((aux *)0xf618);
      iVar10 = (int)lVar15 + 2000;
    }
    else {
      iVar10 = plVar21->port;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    routes.super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    routes.super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    routes.super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    aStack_90._8_8_ = 0;
    uStack_80 = 0;
    _socket_type = 0;
    aStack_90._0_8_ = 0;
    listen_endpoint_t::listen_endpoint_t
              (&ep,(address *)&routes,iVar10,&local_50,plaintext,(listen_socket_flags_t)0x8,
               (address *)&socket_type);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::
    vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
    emplace_back<libtorrent::aux::listen_endpoint_t&>
              ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                *)&eps,&ep);
    this->m_listen_socket_version = this->m_listen_socket_version + 1;
    ::std::__cxx11::string::~string((string *)&ep.device);
  }
  this_00 = &this->m_listen_sockets;
  pvVar17 = this_00;
  __position = partition_listen_sockets(&eps,this_00);
  if ((__position._M_current !=
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (eps.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      eps.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    this->m_listen_socket_version = this->m_listen_socket_version + 1;
  }
  ep_00 = extraout_RDX;
  while (iVar10 = (int)pvVar17,
        __position._M_current !=
        (this->m_listen_sockets).
        super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    pdVar2 = (this->m_dht).
             super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pdVar2 != (dht_tracker *)0x0) {
      ::std::__shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_60,
                   &(__position._M_current)->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                  );
      ::std::__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2>::
      __weak_ptr<libtorrent::aux::listen_socket_t,void>
                ((__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2> *)&ep,
                 &local_60);
      plVar18 = &ep;
      libtorrent::dht::dht_tracker::delete_socket(pdVar2,(listen_socket_handle *)&ep);
      iVar10 = (int)plVar18;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&ep.addr.ipv6_address_);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      ep_00 = extraout_RDX_00;
    }
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
      print_endpoint_abi_cxx11_
                ((string *)&ep,
                 (aux *)&(((__position._M_current)->
                          super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->local_endpoint,ep_00);
      iVar10 = 0x3875de;
      session_log(this,"closing listen socket for %s on device \"%s\"",ep.addr._0_8_,
                  ((((__position._M_current)->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->device)._M_dataplus._M_p);
      ::std::__cxx11::string::~string((string *)&ep);
    }
    peVar13 = ((__position._M_current)->
              super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    pbVar3 = (peVar13->sock).
             super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (pbVar3 != (basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   *)0x0) {
      iVar10 = (int)&ec;
      boost::asio::
      basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::close(pbVar3,iVar10);
      peVar13 = ((__position._M_current)->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    peVar4 = (peVar13->udp_sock).
             super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar4 != (element_type *)0x0) {
      udp_socket::close(&peVar4->sock,iVar10);
      peVar13 = ((__position._M_current)->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    this_01 = (peVar13->natpmp_mapper).
              super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_01 != (natpmp *)0x0) {
      natpmp::close(this_01,iVar10);
      peVar13 = ((__position._M_current)->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    this_02 = (peVar13->upnp_mapper).
              super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_02 != (upnp *)0x0) {
      upnp::close(this_02,iVar10);
      peVar13 = ((__position._M_current)->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    this_03 = (peVar13->lsd).super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_03 != (lsd *)0x0) {
      lsd::close(this_03,iVar10);
    }
    iVar11 = ::std::
             vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ::erase(this_00,(const_iterator)__position._M_current);
    ep_00 = extraout_RDX_01;
    pvVar17 = (vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
               *)__position._M_current;
    __position = iVar11;
  }
  psVar12 = (this_00->
            super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)__position._M_current - (long)psVar12;
  lVar15 = lVar14;
  for (lVar16 = lVar14 >> 6; 0 < lVar16; lVar16 = lVar16 + -1) {
    cVar19._M_current = psVar12;
    if (((psVar12->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
        ._M_ptr)->incoming_connection != false) goto LAB_0028a482;
    if ((psVar12[1].super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->incoming_connection != false) {
      cVar19._M_current = psVar12 + 1;
      goto LAB_0028a482;
    }
    if ((psVar12[2].super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->incoming_connection != false) {
      cVar19._M_current = psVar12 + 2;
      goto LAB_0028a482;
    }
    if ((psVar12[3].super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->incoming_connection != false) {
      cVar19._M_current = psVar12 + 3;
      goto LAB_0028a482;
    }
    psVar12 = psVar12 + 4;
    lVar15 = lVar15 + -0x40;
  }
  lVar15 = lVar15 >> 4;
  if (lVar15 != 1) {
    if (lVar15 != 2) {
      cVar19._M_current = __position._M_current;
      if ((lVar15 != 3) ||
         (cVar19._M_current = psVar12,
         ((psVar12->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr)->incoming_connection != false)) goto LAB_0028a482;
      psVar12 = psVar12 + 1;
    }
    cVar19._M_current = psVar12;
    if (((psVar12->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
        ._M_ptr)->incoming_connection != false) goto LAB_0028a482;
    psVar12 = psVar12 + 1;
  }
  cVar19._M_current = psVar12;
  if (((psVar12->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->incoming_connection == false) {
    cVar19._M_current = __position._M_current;
  }
LAB_0028a482:
  counters::set_value(&this->m_stats_counters,0x116,
                      (ulong)(cVar19._M_current != __position._M_current));
  plVar7 = eps.
           super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ec_00 = eps.
               super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
               ._M_impl.super__Vector_impl_data._M_start; ec_00 != plVar7; ec_00 = ec_00 + 1) {
    setup_listener((session_impl *)&ep,(listen_endpoint_t *)this,(error_code *)ec_00);
    if ((ec.failed_ == false) &&
       ((*(long *)(ep.addr._0_8_ + 0xf8) != 0 || (*(long *)(ep.addr._0_8_ + 0x108) != 0)))) {
      ::std::
      vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>
      ::emplace_back<std::shared_ptr<libtorrent::aux::listen_socket_t>&>
                ((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>
                  *)this_00,(shared_ptr<libtorrent::aux::listen_socket_t> *)&ep);
      pdVar2 = (this->m_dht).
               super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((pdVar2 != (dht_tracker *)0x0) &&
         ((*(char *)(ep.addr._0_8_ + 0xf4) != '\x01' && ((*(byte *)(ep.addr._0_8_ + 0xf5) & 2) == 0)
          ))) {
        ::std::__shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_70,
                     &(this->m_listen_sockets).
                      super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    );
        ::std::__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2>::
        __weak_ptr<libtorrent::aux::listen_socket_t,void>
                  ((__weak_ptr<libtorrent::aux::listen_socket_t,(__gnu_cxx::_Lock_policy)2> *)
                   &routes,&local_70);
        libtorrent::dht::dht_tracker::new_socket(pdVar2,(listen_socket_handle *)&routes);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                   &routes.
                    super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      }
      if (*(long *)(ep.addr._0_8_ + 0xf8) != 0) {
        async_accept(this,(shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                           *)(ep.addr._0_8_ + 0xf8),*(transport *)(ep.addr._0_8_ + 0xf4));
      }
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ep.addr.ipv6_address_);
  }
  psVar12 = (this->m_listen_sockets).
            super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar12 == psVar5) {
    session_log(this,"giving up on binding listen sockets");
  }
  else {
    psVar12 = (pointer)((long)&(psVar12->
                               super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + (lVar14 * 0x10000000 >> 0x1c));
    if (((this->m_alerts).m_alert_mask._M_i.m_val & 0x40) != 0) {
      for (psVar20 = psVar12; psVar20 != psVar5; psVar20 = psVar20 + 1) {
        routes.
        super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)routes.
                              super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffff0000000000);
        routes.
        super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
        peVar13 = (psVar20->
                  super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        pbVar3 = (peVar13->sock).
                 super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (pbVar3 != (basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)0x0) {
          boost::asio::
          basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::local_endpoint((endpoint_type *)&ep,pbVar3,(error_code *)&routes);
          if (routes.
              super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
              ._M_impl.super__Vector_impl_data._M_start._4_1_ == '\0') {
            uVar9 = 0;
            if (((psVar20->
                 super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->ssl == ssl) {
              uVar9 = 6;
            }
            _socket_type = CONCAT71(uStack_97,uVar9);
            alert_manager::
            emplace_alert<libtorrent::listen_succeeded_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::socket_type_t_const&>
                      (&this->m_alerts,(basic_endpoint<boost::asio::ip::tcp> *)&ep,&socket_type);
          }
          peVar13 = (psVar20->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
        }
        peVar4 = (peVar13->udp_sock).
                 super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (peVar4 != (element_type *)0x0) {
          boost::asio::
          basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::local_endpoint((endpoint_type *)&ep,
                           (basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                            *)peVar4,(error_code *)&routes);
          if ((routes.
               super__Vector_base<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_>
               ._M_impl.super__Vector_impl_data._M_start._4_1_ == '\0') &&
             (peVar13 = (psVar20->
                        super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr,
             ((((peVar13->udp_sock).
                super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->sock).field_0xf0 & 1) == 0)) {
            uVar9 = 3;
            if (peVar13->ssl == ssl) {
              uVar9 = 9;
            }
            _socket_type = CONCAT71(uStack_97,uVar9);
            alert_manager::
            emplace_alert<libtorrent::listen_succeeded_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::socket_type_t_const&>
                      (&this->m_alerts,(basic_endpoint<boost::asio::ip::udp> *)&ep,&socket_type);
          }
        }
      }
    }
    iVar10 = session_settings::get_int((session_settings *)this_04,0x4028);
    if (iVar10 != 0) {
      update_peer_dscp(this);
    }
    ec.val_ = 0;
    ec.failed_ = false;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    bVar8 = session_settings::get_bool((session_settings *)this_04,0x803c);
    psVar22 = psVar12;
    if (bVar8) {
      for (; psVar22 != psVar5; psVar22 = psVar22 + 1) {
        start_natpmp(this,psVar22);
      }
    }
    bVar8 = session_settings::get_bool((session_settings *)this_04,0x803b);
    psVar22 = psVar12;
    if (bVar8) {
      for (; psVar22 != psVar5; psVar22 = psVar22 + 1) {
        this_04 = this;
        start_upnp(this,psVar22);
      }
    }
    if (map_ports) {
      psVar5 = (this->m_listen_sockets).
               super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar12 = (this->m_listen_sockets).
                     super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar5;
          psVar12 = psVar12 + 1) {
        remap_ports(this_04,remap_natpmp_and_upnp,
                    (psVar12->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr);
      }
    }
    else {
      for (; psVar12 != psVar5; psVar12 = psVar12 + 1) {
        remap_ports(this_04,remap_natpmp_and_upnp,
                    (psVar12->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr);
      }
    }
    update_lsd(this);
    open_new_incoming_i2p_connection(this);
    psVar6 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar23 = (this->m_torrents).m_array.
                   super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar23 != psVar6;
        psVar23 = psVar23 + 1) {
      torrent::enable_all_trackers
                ((psVar23->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr);
    }
  }
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  ~vector(&eps);
  return;
}

Assistant:

void session_impl::reopen_listen_sockets(bool const map_ports)
	{
#ifndef TORRENT_DISABLE_LOGGING
		session_log("reopen listen sockets");
#endif

		TORRENT_ASSERT(is_single_thread());

		TORRENT_ASSERT(!m_abort);

		error_code ec;

		if (m_abort) return;

		// first build a list of endpoints we should be listening on
		// we need to remove any unneeded sockets first to avoid the possibility
		// of a new socket failing to bind due to a conflict with a stale socket
		std::vector<listen_endpoint_t> eps;

		// if we don't proxy peer connections, don't apply the special logic for
		// proxies
		if (m_settings.get_int(settings_pack::proxy_type) != settings_pack::none
			&& m_settings.get_bool(settings_pack::proxy_peer_connections))
		{
			// we will be able to accept incoming connections over UDP. so use
			// one of the ports the user specified to use a consistent port
			// across sessions. If the user did not specify any ports, pick one
			// at random
			int const port = m_listen_interfaces.empty()
				? int(random(63000) + 2000)
				: m_listen_interfaces.front().port;
			listen_endpoint_t ep(address_v4::any(), port, {}
				, transport::plaintext, listen_socket_t::proxy);
			eps.emplace_back(ep);
			++m_listen_socket_version;
		}
		else
		{
			std::vector<ip_interface> const ifs = enum_net_interfaces(m_io_context, ec);
			if (ec && m_alerts.should_post<listen_failed_alert>())
			{
				m_alerts.emplace_alert<listen_failed_alert>(""
					, operation_t::enum_if, ec, socket_type_t::tcp);
			}
			auto const routes = enum_routes(m_io_context, ec);
			if (ec && m_alerts.should_post<listen_failed_alert>())
			{
				m_alerts.emplace_alert<listen_failed_alert>(""
					, operation_t::enum_route, ec, socket_type_t::tcp);
			}

			// expand device names and populate eps
			for (auto const& iface : m_listen_interfaces)
			{
#if !TORRENT_USE_SSL
				if (iface.ssl)
				{
#ifndef TORRENT_DISABLE_LOGGING
					session_log("attempted to listen ssl with no library support on device: \"%s\""
						, iface.device.c_str());
#endif
					if (m_alerts.should_post<listen_failed_alert>())
					{
						m_alerts.emplace_alert<listen_failed_alert>(iface.device
							, operation_t::sock_open
							, boost::asio::error::operation_not_supported
							, socket_type_t::tcp_ssl);
					}
					continue;
				}
#endif

				// now we have a device to bind to. This device may actually just be an
				// IP address or a device name. In case it's a device name, we want to
				// (potentially) end up binding a socket for each IP address associated
				// with that device.
				interface_to_endpoints(iface, listen_socket_t::accept_incoming, ifs, eps);
			}

			if (eps.empty())
			{
#ifndef TORRENT_DISABLE_LOGGING
				session_log("no listen sockets");
#endif
			}

#if defined TORRENT_ANDROID && __ANDROID_API__ >= 24
			// For Android API >= 24, enum_routes with the current NETLINK based
			// implementation is unsupported (maybe in the future the operation
			// will be restore using another implementation). If routes is empty,
			// allow using unspecified address is a best effort approach that
			// seems to work. The issue with this approach is with the DHTs,
			// because for IPv6 this is not following BEP 32 and BEP 45. See:
			// https://www.bittorrent.org/beps/bep_0032.html
			// https://www.bittorrent.org/beps/bep_0045.html
			if (!routes.empty()) expand_unspecified_address(ifs, routes, eps);
#else
			expand_unspecified_address(ifs, routes, eps);
#endif
			expand_devices(ifs, eps);
		}

		auto remove_iter = partition_listen_sockets(eps, m_listen_sockets);

		if (remove_iter != m_listen_sockets.end() || !eps.empty())
			++m_listen_socket_version;

		while (remove_iter != m_listen_sockets.end())
		{
#ifndef TORRENT_DISABLE_DHT
			if (m_dht)
				m_dht->delete_socket(*remove_iter);
#endif

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("closing listen socket for %s on device \"%s\""
					, print_endpoint((*remove_iter)->local_endpoint).c_str()
					, (*remove_iter)->device.c_str());
			}
#endif
			if ((*remove_iter)->sock) (*remove_iter)->sock->close(ec);
			if ((*remove_iter)->udp_sock) (*remove_iter)->udp_sock->sock.close();
			if ((*remove_iter)->natpmp_mapper) (*remove_iter)->natpmp_mapper->close();
			if ((*remove_iter)->upnp_mapper) (*remove_iter)->upnp_mapper->close();
			if ((*remove_iter)->lsd) (*remove_iter)->lsd->close();
			remove_iter = m_listen_sockets.erase(remove_iter);
		}

		// all sockets in there stayed the same. Only sockets after this point are
		// new and should post alerts
		int const existing_sockets = int(m_listen_sockets.size());

		m_stats_counters.set_value(counters::has_incoming_connections
			, std::any_of(m_listen_sockets.begin(), m_listen_sockets.end()
				, [](std::shared_ptr<listen_socket_t> const& l)
				{ return l->incoming_connection; }));

		// open new sockets on any endpoints that didn't match with
		// an existing socket
		for (auto const& ep : eps)
#ifndef BOOST_NO_EXCEPTIONS
			try
#endif
		{
			std::shared_ptr<listen_socket_t> s = setup_listener(ep, ec);

			if (!ec && (s->sock || s->udp_sock))
			{
				m_listen_sockets.emplace_back(s);

#ifndef TORRENT_DISABLE_DHT
				if (m_dht
					&& s->ssl != transport::ssl
					&& !(s->flags & listen_socket_t::local_network))
				{
					m_dht->new_socket(m_listen_sockets.back());
				}
#endif

				TORRENT_ASSERT(bool(s->flags & listen_socket_t::accept_incoming) == bool(s->sock));
				if (s->sock) async_accept(s->sock, s->ssl);
			}
		}
#ifndef BOOST_NO_EXCEPTIONS
		catch (std::exception const& e)
		{
			TORRENT_UNUSED(e);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("setup_listener(%s) device: %s failed: %s"
					, print_endpoint(ep.addr, ep.port).c_str()
					, ep.device.c_str()
					, e.what());
			}
#endif // TORRENT_DISABLE_LOGGING
		}
#endif // BOOST_NO_EXCEPTIONS

		if (m_listen_sockets.empty())
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("giving up on binding listen sockets");
#endif
			return;
		}

		auto const new_sockets = span<std::shared_ptr<listen_socket_t>>(
			m_listen_sockets).subspan(existing_sockets);

		// now, send out listen_succeeded_alert for the listen sockets we are
		// listening on
		if (m_alerts.should_post<listen_succeeded_alert>())
		{
			for (auto const& l : new_sockets)
			{
				error_code err;
				if (l->sock)
				{
					tcp::endpoint const tcp_ep = l->sock->local_endpoint(err);
					if (!err)
					{
						socket_type_t const socket_type
							= l->ssl == transport::ssl
							? socket_type_t::tcp_ssl
							: socket_type_t::tcp;

						m_alerts.emplace_alert<listen_succeeded_alert>(
							tcp_ep, socket_type);
					}
				}

				if (l->udp_sock)
				{
					udp::endpoint const udp_ep = l->udp_sock->sock.local_endpoint(err);
					if (!err && l->udp_sock->sock.is_open())
					{
						socket_type_t const socket_type
							= l->ssl == transport::ssl
							? socket_type_t::utp_ssl
							: socket_type_t::utp;

						m_alerts.emplace_alert<listen_succeeded_alert>(
							udp_ep, socket_type);
					}
				}
			}
		}

		if (m_settings.get_int(settings_pack::peer_dscp) != 0)
		{
			update_peer_dscp();
		}

		ec.clear();

		if (m_settings.get_bool(settings_pack::enable_natpmp))
		{
			for (auto const& s : new_sockets)
				start_natpmp(s);
		}

		if (m_settings.get_bool(settings_pack::enable_upnp))
		{
			for (auto const& s : new_sockets)
				start_upnp(s);
		}

		if (map_ports)
		{
			for (auto const& s : m_listen_sockets)
				remap_ports(remap_natpmp_and_upnp, *s);
		}
		else
		{
			// new sockets need to map ports even if the caller did not request
			// re-mapping
			for (auto const& s : new_sockets)
				remap_ports(remap_natpmp_and_upnp, *s);
		}

		update_lsd();

#if TORRENT_USE_I2P
		open_new_incoming_i2p_connection();
#endif

		// trackers that were not reachable, may have become reachable now.
		// so clear the "disabled" flags to let them be tried one more time
		// TODO: it would probably be better to do this by having a
		// listen-socket "version" number that gets bumped. And instead of
		// setting a bool to disable a tracker, we set the version number that
		// it was disabled at. This change would affect the ABI in 1.2, so
		// should be done in 2.0 or later
		for (auto& t : m_torrents)
			t->enable_all_trackers();
	}